

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall
QMainWindowLayoutState::checkFormat(QMainWindowLayoutState *this,QDataStream *stream)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockWidget_*> local_e8;
  QRect local_c8;
  uchar marker;
  QDockAreaLayoutInfo info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    cVar2 = QDataStream::atEnd();
    if (cVar2 != '\0') break;
    marker = 0xaa;
    QDataStream::operator>>(stream,&marker);
    switch(marker) {
    case 0xf9:
      local_c8.x1.m_i = 0;
      local_c8.y1.m_i = 0;
      local_c8.x2.m_i = -1;
      local_c8.y2.m_i = -1;
      ::operator>>(stream,&local_c8);
      info.tabBar = (QTabBar *)&DAT_aaaaaaaaaaaaaaaa;
      info._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
      info.item_list.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      info._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      info.item_list.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      info.item_list.d.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
      info.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      info.mainWindow = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
      info._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      info.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      info.separatorWidgets.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      info.separatorWidgets.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      info.sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
      info.separatorWidgets.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayoutInfo::QDockAreaLayoutInfo(&info);
      local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets((QList<QDockWidget_*> *)&local_e8,&this->mainWindow->super_QWidget);
      bVar3 = QDockAreaLayoutInfo::restoreState(&info,stream,(QList<QDockWidget_*> *)&local_e8,true)
      ;
      QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&local_e8);
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&info);
      break;
    default:
      goto switchD_00400bcf_caseD_fa;
    case 0xfc:
    case 0xfe:
      info.separatorWidgets.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      info.sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
      info.separatorWidgets.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      findChildrenHelper<QToolBar*>((QList<QToolBar_*> *)&info,(QObject *)this->mainWindow);
      bVar3 = QToolBarAreaLayout::restoreState
                        (&this->toolBarAreaLayout,stream,(QList<QToolBar_*> *)&info,marker,true);
      QArrayDataPointer<QToolBar_*>::~QArrayDataPointer((QArrayDataPointer<QToolBar_*> *)&info);
      break;
    case 0xfd:
      info.separatorWidgets.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      info.sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
      info.separatorWidgets.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets((QList<QDockWidget_*> *)&info,&this->mainWindow->super_QWidget);
      bVar3 = QDockAreaLayout::restoreState
                        (&this->dockAreaLayout,stream,(QList<QDockWidget_*> *)&info,true);
      QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer
                ((QArrayDataPointer<QDockWidget_*> *)&info);
    }
  } while (bVar3 != false);
switchD_00400bcf_caseD_fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::checkFormat(QDataStream &stream)
{
    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker, true /*testing*/)) {
                            return false;
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets, true /*testing*/)) {
                        return false;
                    }
                }
                break;
#if QT_CONFIG(tabbar)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
                {
                    QRect geom;
                    stream >> geom;
                    QDockAreaLayoutInfo info;
                    auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!info.restoreState(stream, dockWidgets, true /* testing*/))
                        return false;
                }
                break;
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
            default:
                //there was an error during the parsing
                return false;
        }// switch
    } //while

    //everything went fine: it must be a pre-4.3 saved state
    return true;
}